

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_iarchive.h
# Opt level: O2

void __thiscall serialization::xml_iarchive::load<int>(xml_iarchive *this,int *v)

{
  char *pcVar1;
  _Elt_pointer ppxVar2;
  char *pcVar3;
  stringstream ss;
  long local_198 [2];
  ostream local_188 [16];
  byte abStack_178 [360];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_198);
  ppxVar2 = (this->stack_).c.
            super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppxVar2 ==
      (this->stack_).c.
      super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppxVar2 = (this->stack_).c.
              super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pcVar1 = (ppxVar2[-1]->super_xml_base<char>).m_value;
  pcVar3 = &rapidxml::xml_base<char>::nullstr()::zero;
  if (pcVar1 != (char *)0x0) {
    pcVar3 = pcVar1;
  }
  std::operator<<(local_188,pcVar3);
  std::istream::operator>>((istream *)local_198,v);
  if ((abStack_178[*(long *)(local_198[0] + -0x18)] & 2) == 0) {
    throw_serialization_error("load ","xml");
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  return;
}

Assistant:

void load(T & v) const
    {
        std::stringstream ss;
        ss << stack_.top()->value();
        ss >> v;
        if(!ss.eof())
        {
            throw_serialization_error("load ", "xml");
        }
    }